

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

size_t __thiscall
flatbuffers::vector_downward<unsigned_int>::ensure_space
          (vector_downward<unsigned_int> *this,size_t len)

{
  uint uVar1;
  bool bVar2;
  size_t len_local;
  vector_downward<unsigned_int> *this_local;
  
  bVar2 = false;
  if (this->scratch_ <= this->cur_) {
    bVar2 = this->buf_ <= this->scratch_;
  }
  if (!bVar2) {
    __assert_fail("cur_ >= scratch_ && scratch_ >= buf_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                  ,0x8e,
                  "size_t flatbuffers::vector_downward<>::ensure_space(size_t) [SizeT = unsigned int]"
                 );
  }
  uVar1 = unused_buffer_size(this);
  if (uVar1 < len) {
    reallocate(this,len);
  }
  uVar1 = size(this);
  if (uVar1 < this->max_size_) {
    return len;
  }
  __assert_fail("size() < max_size_",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                ,0x92,
                "size_t flatbuffers::vector_downward<>::ensure_space(size_t) [SizeT = unsigned int]"
               );
}

Assistant:

size_t ensure_space(size_t len) {
    FLATBUFFERS_ASSERT(cur_ >= scratch_ && scratch_ >= buf_);
    // If the length is larger than the unused part of the buffer, we need to
    // grow.
    if (len > unused_buffer_size()) { reallocate(len); }
    FLATBUFFERS_ASSERT(size() < max_size_);
    return len;
  }